

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssp_blas2.c
# Opt level: O3

int sp_strsv(char *uplo,char *trans,char *diag,SuperMatrix *L,SuperMatrix *U,float *x,
            SuperLUStat_t *stat,int *info)

{
  float *M;
  real *a;
  int iVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  bool bVar7;
  float *pfVar8;
  long lVar9;
  ulong uVar10;
  int iVar11;
  long lVar12;
  int iVar13;
  long lVar14;
  float *pfVar15;
  void *pvVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  uint uVar20;
  int iVar21;
  int *piVar22;
  float fVar23;
  float fVar24;
  int nsupc;
  undefined8 local_170;
  float *local_168;
  void *local_160;
  float *local_158;
  int incx;
  long local_148;
  long local_140;
  int nsupr;
  
  incx = 1;
  *info = 0;
  if ((*uplo != 'U') && (*uplo != 'L')) {
    iVar21 = 1;
    iVar13 = -1;
LAB_0010d890:
    *info = iVar13;
    nsupr = iVar21;
    input_error("sp_strsv",&nsupr);
    return 0;
  }
  iVar21 = 2;
  iVar13 = -2;
  if ((0x11 < (byte)*trans - 0x43) || ((0x20801U >> ((byte)*trans - 0x43 & 0x1f) & 1) == 0))
  goto LAB_0010d890;
  if ((*diag != 'U') && (*diag != 'N')) {
    iVar21 = 3;
    iVar13 = -3;
    goto LAB_0010d890;
  }
  iVar1 = L->nrow;
  iVar21 = 4;
  iVar13 = -4;
  if (((long)iVar1 < 0) || (iVar1 != L->ncol)) goto LAB_0010d890;
  iVar21 = 5;
  iVar13 = -5;
  if ((U->nrow < 0) || (U->nrow != U->ncol)) goto LAB_0010d890;
  local_160 = L->Store;
  lVar5 = *(long *)((long)local_160 + 8);
  local_158 = (float *)U->Store;
  lVar12 = *(long *)(local_158 + 2);
  local_170 = U;
  local_168 = floatCalloc((long)iVar1);
  if (local_168 == (float *)0x0) {
    sprintf((char *)&nsupr,"%s at line %d in file %s\n","Malloc fails for work in sp_strsv().",0x7f,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/ssp_blas2.c");
    superlu_abort_and_exit((char *)&nsupr);
  }
  pfVar8 = local_158;
  pfVar15 = local_168;
  if (*trans == 'N') {
    if (*uplo == 'L') {
      if (L->nrow == 0) {
        return 0;
      }
      if (-1 < *(int *)((long)local_160 + 4)) {
        local_140 = lVar5 + 4;
        fVar24 = 0.0;
        lVar12 = 0;
        pvVar16 = local_160;
        do {
          lVar18 = *(long *)((long)pvVar16 + 0x20);
          iVar21 = *(int *)(*(long *)((long)pvVar16 + 0x30) + lVar12 * 4);
          lVar9 = (long)iVar21;
          uVar2 = *(uint *)(lVar18 + lVar9 * 4);
          nsupr = *(int *)(lVar18 + 4 + lVar9 * 4) - uVar2;
          iVar21 = *(int *)(*(long *)((long)pvVar16 + 0x30) + 4 + lVar12 * 4) - iVar21;
          lVar17 = (long)*(int *)(*(long *)((long)pvVar16 + 0x10) + lVar9 * 4);
          uVar20 = nsupr - iVar21;
          nsupc = iVar21;
          if (iVar21 == 1) {
            iVar13 = *(int *)(lVar18 + 4 + lVar9 * 4);
            if ((int)((long)(int)uVar2 + 1) < iVar13) {
              lVar18 = *(long *)((long)pvVar16 + 0x18);
              lVar14 = 0;
              do {
                iVar1 = *(int *)(((long)(int)uVar2 + 1) * 4 + lVar18 + lVar14 * 4);
                x[iVar1] = x[iVar1] - x[lVar9] * *(float *)(local_140 + lVar17 * 4 + lVar14 * 4);
                lVar14 = lVar14 + 1;
              } while (~uVar2 + iVar13 != (int)lVar14);
            }
          }
          else {
            local_158 = x + lVar9;
            local_170 = (SuperMatrix *)CONCAT44(local_170._4_4_,fVar24);
            local_148 = lVar17;
            slsolve(nsupr,iVar21,(float *)(lVar5 + lVar17 * 4),local_158);
            smatvec(nsupr,nsupr - nsupc,nsupc,(float *)(lVar5 + (long)((int)local_148 + nsupc) * 4),
                    local_158,local_168);
            pfVar15 = local_168;
            pvVar16 = local_160;
            fVar24 = (float)local_170;
            if (0 < (int)uVar20) {
              lVar18 = *(long *)((long)local_160 + 0x18);
              uVar10 = 0;
              do {
                iVar13 = *(int *)((long)(int)(uVar2 + nsupc) * 4 + lVar18 + uVar10 * 4);
                x[iVar13] = x[iVar13] - local_168[uVar10];
                local_168[uVar10] = 0.0;
                uVar10 = uVar10 + 1;
              } while (uVar10 < uVar20);
            }
          }
          fVar24 = fVar24 + (float)((iVar21 + -1) * iVar21) + (float)(int)(uVar20 * iVar21 * 2);
          bVar7 = lVar12 < *(int *)((long)pvVar16 + 4);
          lVar12 = lVar12 + 1;
        } while (bVar7);
        goto LAB_0010dcea;
      }
    }
    else {
      if (local_170->nrow == 0) {
        return 0;
      }
      if (-1 < (long)*(int *)((long)local_160 + 4)) {
        lVar18 = *(long *)((long)local_160 + 0x30);
        fVar24 = 0.0;
        pvVar16 = local_160;
        lVar9 = (long)*(int *)((long)local_160 + 4);
        do {
          iVar21 = *(int *)(lVar18 + lVar9 * 4);
          lVar17 = (long)iVar21;
          nsupr = *(int *)(*(long *)((long)pvVar16 + 0x20) + 4 + lVar17 * 4) -
                  *(int *)(*(long *)((long)pvVar16 + 0x20) + lVar17 * 4);
          nsupc = *(int *)(lVar18 + 4 + lVar9 * 4) - iVar21;
          fVar24 = (float)((nsupc + 1) * nsupc) + fVar24;
          M = (float *)(lVar5 + (long)*(int *)(*(long *)((long)pvVar16 + 0x10) + lVar17 * 4) * 4);
          if (nsupc == 1) {
            x[lVar17] = x[lVar17] / *M;
            iVar21 = *(int *)(*(long *)(pfVar8 + 6) + lVar17 * 4);
            lVar14 = (long)iVar21;
            iVar13 = *(int *)(*(long *)(pfVar8 + 6) + 4 + lVar17 * 4);
            if (iVar21 < iVar13) {
              lVar6 = *(long *)(pfVar8 + 4);
              do {
                iVar21 = *(int *)(lVar6 + lVar14 * 4);
                x[iVar21] = x[iVar21] - x[lVar17] * *(float *)(lVar12 + lVar14 * 4);
                lVar14 = lVar14 + 1;
              } while (iVar13 != lVar14);
            }
          }
          else {
            local_170 = (SuperMatrix *)CONCAT44(local_170._4_4_,fVar24);
            susolve(nsupr,nsupc,M,x + lVar17);
            lVar18 = *(long *)((long)local_160 + 0x30);
            iVar13 = *(int *)(lVar18 + 4 + lVar9 * 4);
            pfVar15 = local_168;
            pvVar16 = local_160;
            fVar24 = (float)local_170;
            if (iVar21 < iVar13) {
              lVar14 = *(long *)(pfVar8 + 6);
              iVar21 = *(int *)(lVar14 + lVar17 * 4);
              do {
                iVar1 = *(int *)(lVar14 + 4 + lVar17 * 4);
                if (iVar1 - iVar21 != 0 && iVar21 <= iVar1) {
                  lVar6 = *(long *)(pfVar8 + 4);
                  lVar19 = (long)iVar21;
                  do {
                    iVar3 = *(int *)(lVar6 + lVar19 * 4);
                    x[iVar3] = x[iVar3] - x[lVar17] * *(float *)(lVar12 + lVar19 * 4);
                    lVar19 = lVar19 + 1;
                  } while (iVar1 != lVar19);
                }
                lVar17 = lVar17 + 1;
                fVar24 = fVar24 + (float)((iVar1 - iVar21) * 2);
                iVar21 = iVar1;
              } while (lVar17 != iVar13);
            }
          }
          bVar7 = 0 < lVar9;
          lVar9 = lVar9 + -1;
        } while (bVar7);
        goto LAB_0010dcea;
      }
    }
  }
  else if (*uplo == 'L') {
    if (L->nrow == 0) {
      return 0;
    }
    if (-1 < (long)*(int *)((long)local_160 + 4)) {
      fVar24 = 0.0;
      lVar12 = (long)*(int *)((long)local_160 + 4);
      do {
        lVar18 = *(long *)((long)local_160 + 0x30);
        iVar21 = *(int *)(lVar18 + lVar12 * 4);
        lVar17 = (long)iVar21;
        iVar13 = *(int *)(*(long *)((long)local_160 + 0x20) + lVar17 * 4);
        nsupr = *(int *)(*(long *)((long)local_160 + 0x20) + 4 + lVar17 * 4) - iVar13;
        nsupc = *(int *)(lVar18 + 4 + lVar12 * 4) - iVar21;
        lVar9 = *(long *)((long)local_160 + 0x10);
        iVar1 = *(int *)(lVar9 + lVar17 * 4);
        local_158 = (float *)CONCAT44(local_158._4_4_,iVar1);
        iVar3 = *(int *)(lVar18 + 4 + lVar12 * 4);
        if (iVar21 < iVar3) {
          lVar18 = lVar17;
          iVar21 = iVar1;
          do {
            iVar11 = iVar21 + nsupc;
            iVar21 = *(int *)(lVar9 + 4 + lVar18 * 4);
            if (iVar11 < iVar21) {
              fVar23 = x[lVar18];
              lVar14 = (long)iVar11;
              piVar22 = (int *)(*(long *)((long)local_160 + 0x18) + (long)(iVar13 + nsupc) * 4);
              do {
                fVar23 = fVar23 - x[*piVar22] * *(float *)(lVar5 + lVar14 * 4);
                x[lVar18] = fVar23;
                lVar14 = lVar14 + 1;
                piVar22 = piVar22 + 1;
              } while (lVar14 < iVar21);
            }
            lVar18 = lVar18 + 1;
          } while (lVar18 != iVar3);
        }
        fVar24 = fVar24 + (float)((nsupr - nsupc) * nsupc * 2);
        if (1 < nsupc) {
          local_170 = (SuperMatrix *)
                      CONCAT44(local_170._4_4_,fVar24 + (float)((nsupc + -1) * nsupc));
          strsv_("L","T","U",&nsupc,(real *)(lVar5 + (long)iVar1 * 4),&nsupr,x + lVar17,&incx);
          fVar24 = (float)local_170;
        }
        bVar7 = 0 < lVar12;
        pfVar15 = local_168;
        lVar12 = lVar12 + -1;
      } while (bVar7);
      goto LAB_0010dcea;
    }
  }
  else {
    if (local_170->nrow == 0) {
      return 0;
    }
    iVar21 = *(int *)((long)local_160 + 4);
    if (-1 < iVar21) {
      fVar24 = 0.0;
      lVar18 = 0;
      do {
        local_148 = CONCAT44(local_148._4_4_,iVar21);
        lVar9 = *(long *)((long)local_160 + 0x30);
        iVar13 = *(int *)(lVar9 + lVar18 * 4);
        lVar17 = (long)iVar13;
        nsupr = *(int *)(*(long *)((long)local_160 + 0x20) + 4 + lVar17 * 4) -
                *(int *)(*(long *)((long)local_160 + 0x20) + lVar17 * 4);
        iVar11 = *(int *)(lVar9 + 4 + lVar18 * 4) - iVar13;
        iVar1 = *(int *)(*(long *)((long)local_160 + 0x10) + lVar17 * 4);
        local_170 = (SuperMatrix *)(long)iVar1;
        iVar3 = *(int *)(lVar9 + 4 + lVar18 * 4);
        if (iVar13 < iVar3) {
          lVar9 = *(long *)(local_158 + 6);
          lVar14 = lVar17;
          iVar13 = *(int *)(lVar9 + lVar17 * 4);
          do {
            iVar4 = *(int *)(lVar9 + 4 + lVar14 * 4);
            if (iVar4 - iVar13 != 0 && iVar13 <= iVar4) {
              lVar6 = *(long *)(local_158 + 4);
              fVar23 = x[lVar14];
              lVar19 = (long)iVar13;
              do {
                fVar23 = fVar23 - x[*(int *)(lVar6 + lVar19 * 4)] * *(float *)(lVar12 + lVar19 * 4);
                x[lVar14] = fVar23;
                lVar19 = lVar19 + 1;
              } while (iVar4 != lVar19);
            }
            lVar14 = lVar14 + 1;
            fVar24 = fVar24 + (float)((iVar4 - iVar13) * 2);
            iVar13 = iVar4;
          } while (lVar14 != iVar3);
        }
        a = (real *)(lVar5 + (long)local_170 * 4);
        nsupc = iVar11;
        if (iVar11 == 1) {
          x[lVar17] = x[lVar17] / *a;
        }
        else {
          local_170._4_4_ = iVar1 >> 0x1f;
          local_170 = (SuperMatrix *)CONCAT44(local_170._4_4_,fVar24);
          strsv_("U","T","N",&nsupc,a,&nsupr,x + lVar17,&incx);
          iVar21 = *(int *)((long)local_160 + 4);
          fVar24 = (float)local_170;
        }
        fVar24 = fVar24 + (float)((iVar11 + 1) * iVar11);
        bVar7 = lVar18 < iVar21;
        pfVar15 = local_168;
        lVar18 = lVar18 + 1;
      } while (bVar7);
      goto LAB_0010dcea;
    }
  }
  fVar24 = 0.0;
LAB_0010dcea:
  stat->ops[0x11] = fVar24 + stat->ops[0x11];
  superlu_free(pfVar15);
  return 0;
}

Assistant:

int
sp_strsv(char *uplo, char *trans, char *diag, SuperMatrix *L, 
         SuperMatrix *U, float *x, SuperLUStat_t *stat, int *info)
{
#ifdef _CRAY
    _fcd ftcs1 = _cptofcd("L", strlen("L")),
	 ftcs2 = _cptofcd("N", strlen("N")),
	 ftcs3 = _cptofcd("U", strlen("U"));
#endif
    SCformat *Lstore;
    NCformat *Ustore;
    float   *Lval, *Uval;
    int incx = 1, incy = 1;
    float alpha = 1.0, beta = 1.0;
    int nrow, irow, jcol;
    int fsupc, nsupr, nsupc;
    int_t luptr, istart, i, k, iptr;
    float *work;
    flops_t solve_ops;

    /* Test the input parameters */
    *info = 0;
    if ( strncmp(uplo,"L", 1)!=0 && strncmp(uplo, "U", 1)!=0 ) *info = -1;
    else if ( strncmp(trans, "N", 1)!=0 && strncmp(trans, "T", 1)!=0 && 
              strncmp(trans, "C", 1)!=0) *info = -2;
    else if ( strncmp(diag, "U", 1)!=0 && strncmp(diag, "N", 1)!=0 )
         *info = -3;
    else if ( L->nrow != L->ncol || L->nrow < 0 ) *info = -4;
    else if ( U->nrow != U->ncol || U->nrow < 0 ) *info = -5;
    if ( *info ) {
	int ii = -(*info);
	input_error("sp_strsv", &ii);
	return 0;
    }

    Lstore = L->Store;
    Lval = Lstore->nzval;
    Ustore = U->Store;
    Uval = Ustore->nzval;
    solve_ops = 0;

    if ( !(work = floatCalloc(L->nrow)) )
	ABORT("Malloc fails for work in sp_strsv().");
    
    if ( strncmp(trans, "N", 1)==0 ) {	/* Form x := inv(A)*x. */
	
	if ( strncmp(uplo, "L", 1)==0 ) {
	    /* Form x := inv(L)*x */
    	    if ( L->nrow == 0 ) return 0; /* Quick return */
	    
	    for (k = 0; k <= Lstore->nsuper; k++) {
		fsupc = L_FST_SUPC(k);
		istart = L_SUB_START(fsupc);
		nsupr = L_SUB_START(fsupc+1) - istart;
		nsupc = L_FST_SUPC(k+1) - fsupc;
		luptr = L_NZ_START(fsupc);
		nrow = nsupr - nsupc;

	        solve_ops += nsupc * (nsupc - 1);
	        solve_ops += 2 * nrow * nsupc;

		if ( nsupc == 1 ) {
		    for (iptr=istart+1; iptr < L_SUB_START(fsupc+1); ++iptr) {
			irow = L_SUB(iptr);
			++luptr;
			x[irow] -= x[fsupc] * Lval[luptr];
		    }
		} else {
#ifdef USE_VENDOR_BLAS
#ifdef _CRAY
		    STRSV(ftcs1, ftcs2, ftcs3, &nsupc, &Lval[luptr], &nsupr,
		       	&x[fsupc], &incx);
		
		    SGEMV(ftcs2, &nrow, &nsupc, &alpha, &Lval[luptr+nsupc], 
		       	&nsupr, &x[fsupc], &incx, &beta, &work[0], &incy);
#else
		    strsv_("L", "N", "U", &nsupc, &Lval[luptr], &nsupr,
		       	&x[fsupc], &incx);
		
		    sgemv_("N", &nrow, &nsupc, &alpha, &Lval[luptr+nsupc], 
		       	&nsupr, &x[fsupc], &incx, &beta, &work[0], &incy);
#endif
#else
		    slsolve ( nsupr, nsupc, &Lval[luptr], &x[fsupc]);
		
		    smatvec ( nsupr, nsupr-nsupc, nsupc, &Lval[luptr+nsupc],
                             &x[fsupc], &work[0] );
#endif		
		
		    iptr = istart + nsupc;
		    for (i = 0; i < nrow; ++i, ++iptr) {
			irow = L_SUB(iptr);
			x[irow] -= work[i];	/* Scatter */
			work[i] = 0.0;

		    }
	 	}
	    } /* for k ... */
	    
	} else {
	    /* Form x := inv(U)*x */
	    
	    if ( U->nrow == 0 ) return 0; /* Quick return */
	    
	    for (k = Lstore->nsuper; k >= 0; k--) {
	    	fsupc = L_FST_SUPC(k);
	    	nsupr = L_SUB_START(fsupc+1) - L_SUB_START(fsupc);
	    	nsupc = L_FST_SUPC(k+1) - fsupc;
	    	luptr = L_NZ_START(fsupc);
		
    	        solve_ops += nsupc * (nsupc + 1);

		if ( nsupc == 1 ) {
		    x[fsupc] /= Lval[luptr];
		    for (i = U_NZ_START(fsupc); i < U_NZ_START(fsupc+1); ++i) {
			irow = U_SUB(i);
			x[irow] -= x[fsupc] * Uval[i];
		    }
		} else {
#ifdef USE_VENDOR_BLAS
#ifdef _CRAY
		    STRSV(ftcs3, ftcs2, ftcs2, &nsupc, &Lval[luptr], &nsupr,
		       &x[fsupc], &incx);
#else
		    strsv_("U", "N", "N", &nsupc, &Lval[luptr], &nsupr,
                           &x[fsupc], &incx);
#endif
#else		
		    susolve ( nsupr, nsupc, &Lval[luptr], &x[fsupc] );
#endif		

		    for (jcol = fsupc; jcol < L_FST_SUPC(k+1); jcol++) {
		        solve_ops += 2*(U_NZ_START(jcol+1) - U_NZ_START(jcol));
		    	for (i = U_NZ_START(jcol); i < U_NZ_START(jcol+1); 
				i++) {
			    irow = U_SUB(i);
			    x[irow] -= x[jcol] * Uval[i];
		    	}
                    }
		}
	    } /* for k ... */
	    
	}
    } else { /* Form x := inv(A')*x */
	
	if ( strncmp(uplo, "L", 1)==0 ) {
	    /* Form x := inv(L')*x */
    	    if ( L->nrow == 0 ) return 0; /* Quick return */
	    
	    for (k = Lstore->nsuper; k >= 0; --k) {
	    	fsupc = L_FST_SUPC(k);
	    	istart = L_SUB_START(fsupc);
	    	nsupr = L_SUB_START(fsupc+1) - istart;
	    	nsupc = L_FST_SUPC(k+1) - fsupc;
	    	luptr = L_NZ_START(fsupc);

		solve_ops += 2 * (nsupr - nsupc) * nsupc;

		for (jcol = fsupc; jcol < L_FST_SUPC(k+1); jcol++) {
		    iptr = istart + nsupc;
		    for (i = L_NZ_START(jcol) + nsupc; 
				i < L_NZ_START(jcol+1); i++) {
			irow = L_SUB(iptr);
			x[jcol] -= x[irow] * Lval[i];
			iptr++;
		    }
		}
		
		if ( nsupc > 1 ) {
		    solve_ops += nsupc * (nsupc - 1);
#ifdef _CRAY
                    ftcs1 = _cptofcd("L", strlen("L"));
                    ftcs2 = _cptofcd("T", strlen("T"));
                    ftcs3 = _cptofcd("U", strlen("U"));
		    STRSV(ftcs1, ftcs2, ftcs3, &nsupc, &Lval[luptr], &nsupr,
			&x[fsupc], &incx);
#else
		    strsv_("L", "T", "U", &nsupc, &Lval[luptr], &nsupr,
			&x[fsupc], &incx);
#endif
		}
	    }
	} else {
	    /* Form x := inv(U')*x */
	    if ( U->nrow == 0 ) return 0; /* Quick return */
	    
	    for (k = 0; k <= Lstore->nsuper; k++) {
	    	fsupc = L_FST_SUPC(k);
	    	nsupr = L_SUB_START(fsupc+1) - L_SUB_START(fsupc);
	    	nsupc = L_FST_SUPC(k+1) - fsupc;
	    	luptr = L_NZ_START(fsupc);

		for (jcol = fsupc; jcol < L_FST_SUPC(k+1); jcol++) {
		    solve_ops += 2*(U_NZ_START(jcol+1) - U_NZ_START(jcol));
		    for (i = U_NZ_START(jcol); i < U_NZ_START(jcol+1); i++) {
			irow = U_SUB(i);
			x[jcol] -= x[irow] * Uval[i];
		    }
		}

		solve_ops += nsupc * (nsupc + 1);

		if ( nsupc == 1 ) {
		    x[fsupc] /= Lval[luptr];
		} else {
#ifdef _CRAY
                    ftcs1 = _cptofcd("U", strlen("U"));
                    ftcs2 = _cptofcd("T", strlen("T"));
                    ftcs3 = _cptofcd("N", strlen("N"));
		    STRSV( ftcs1, ftcs2, ftcs3, &nsupc, &Lval[luptr], &nsupr,
			    &x[fsupc], &incx);
#else
		    strsv_("U", "T", "N", &nsupc, &Lval[luptr], &nsupr,
			    &x[fsupc], &incx);
#endif
		}
	    } /* for k ... */
	}
    }

    stat->ops[SOLVE] += solve_ops;
    SUPERLU_FREE(work);
    return 0;
}